

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  ushort x;
  ushort uVar1;
  int iVar2;
  container_t *candidate_shared_container;
  _Bool _Var3;
  uint uVar4;
  uint pos;
  array_container_t *container1;
  array_container_t *container2;
  uint uVar5;
  ulong uVar6;
  byte local_3a;
  byte local_39;
  uint local_38;
  uint local_34;
  
  local_38 = (r1->high_low_container).size;
  iVar2 = (r2->high_low_container).size;
  pos = 0;
  uVar5 = 0;
  do {
    if ((int)local_38 <= (int)uVar5) {
LAB_001145a3:
      return uVar5 == local_38;
    }
    local_34 = uVar5 + 1;
    uVar6 = (ulong)uVar5 & 0xffff;
    while( true ) {
      if (iVar2 <= (int)pos) goto LAB_001145a3;
      x = (r1->high_low_container).keys[uVar6];
      uVar4 = pos & 0xffff;
      uVar1 = (r2->high_low_container).keys[uVar4];
      if (x == uVar1) break;
      if (x < uVar1) {
        return false;
      }
      pos = ra_advance_until(&r2->high_low_container,x,pos);
    }
    local_39 = (r1->high_low_container).typecodes[uVar6];
    local_3a = (r2->high_low_container).typecodes[uVar4];
    candidate_shared_container = (r2->high_low_container).containers[uVar4];
    container1 = (array_container_t *)
                 container_unwrap_shared((r1->high_low_container).containers[uVar6],&local_39);
    container2 = (array_container_t *)container_unwrap_shared(candidate_shared_container,&local_3a);
    switch((uint)local_3a + (uint)local_39 * 4) {
    case 5:
      _Var3 = bitset_container_is_subset
                        ((bitset_container_t *)container1,(bitset_container_t *)container2);
      break;
    case 6:
      goto LAB_001145af;
    case 7:
      _Var3 = bitset_container_is_subset_run
                        ((bitset_container_t *)container1,(run_container_t *)container2);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x12d5,
                    "_Bool container_is_subset(const container_t *, uint8_t, const container_t *, uint8_t)"
                   );
    case 9:
      _Var3 = array_container_is_subset_bitset(container1,(bitset_container_t *)container2);
      break;
    case 10:
      _Var3 = array_container_is_subset(container1,container2);
      break;
    case 0xb:
      _Var3 = array_container_is_subset_run(container1,(run_container_t *)container2);
      break;
    case 0xd:
      _Var3 = run_container_is_subset_bitset
                        ((run_container_t *)container1,(bitset_container_t *)container2);
      break;
    case 0xe:
      _Var3 = run_container_is_subset_array((run_container_t *)container1,container2);
      break;
    case 0xf:
      _Var3 = run_container_is_subset((run_container_t *)container1,(run_container_t *)container2);
    }
    if (_Var3 == false) {
LAB_001145af:
      return false;
    }
    pos = pos + 1;
    uVar5 = local_34;
  } while( true );
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size,
              length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(ra1, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(ra2, pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2))
                return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}